

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O1

void Fxu_HeapSinglePrint(FILE *pFile,Fxu_HeapSingle *p)

{
  int iVar1;
  Fxu_Single *pFVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  Fxu_HeapSingleCheck(p);
  uVar5 = 1;
  fwrite("The contents of the heap:\n",0x1a,1,(FILE *)pFile);
  uVar4 = 1;
  fprintf((FILE *)pFile,"Level %d:  ",1);
  p->i = 1;
  if (0 < p->nItems) {
    iVar3 = 1;
    do {
      if (p->pTree[iVar3] == (Fxu_Single *)0x0) break;
      pFVar2 = p->pTree[uVar5];
      if (uVar5 != (uint)pFVar2->HNum) {
        __assert_fail("Counter == p->pTree[Counter]->HNum",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapS.c"
                      ,0x83,"void Fxu_HeapSinglePrint(FILE *, Fxu_HeapSingle *)");
      }
      fprintf((FILE *)pFile,"%2d=%3d  ",uVar5 & 0xffffffff,(ulong)(uint)pFVar2->Weight);
      uVar5 = uVar5 + 1;
      if (uVar5 == (uint)(1 << ((byte)uVar4 & 0x1f))) {
        fputc(10,(FILE *)pFile);
        uVar4 = uVar4 + 1;
        fprintf((FILE *)pFile,"Level %d:  ",(ulong)uVar4);
      }
      iVar1 = p->i;
      iVar3 = iVar1 + 1;
      p->i = iVar3;
    } while (iVar1 < p->nItems);
  }
  fputc(10,(FILE *)pFile);
  fwrite("End of the heap printout.\n",0x1a,1,(FILE *)pFile);
  return;
}

Assistant:

void Fxu_HeapSinglePrint( FILE * pFile, Fxu_HeapSingle * p )
{
    Fxu_Single * pSingle;
    int Counter = 1;
    int Degree  = 1;

    Fxu_HeapSingleCheck( p );
    fprintf( pFile, "The contents of the heap:\n" );
    fprintf( pFile, "Level %d:  ", Degree );
    Fxu_HeapSingleForEachItem( p, pSingle )
    {
        assert( Counter == p->pTree[Counter]->HNum );
        fprintf( pFile, "%2d=%3d  ", Counter, FXU_HEAP_SINGLE_WEIGHT(p->pTree[Counter]) );
        if ( ++Counter == (1 << Degree) )
        {
            fprintf( pFile, "\n" );
            Degree++;
            fprintf( pFile, "Level %d:  ", Degree );
        }
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "End of the heap printout.\n" );
}